

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::presolveChangedRows(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int row;
  int *piVar1;
  pointer piVar2;
  Result RVar3;
  vector<int,_std::allocator<int>_> *__range1;
  iterator __begin1;
  int *piVar4;
  iterator __end1;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (long)this->model->num_row_ - (long)this->numDeletedRows);
  piVar4 = (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
  (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
  (this->changedRowIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = piVar4;
  local_48._M_impl.super__Vector_impl_data._M_finish = piVar1;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = piVar2;
  for (; piVar4 != piVar1; piVar4 = piVar4 + 1) {
    row = *piVar4;
    if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[row] == '\0') {
      RVar3 = rowPresolve(this,postsolve_stack,row);
      if (RVar3 != kOk) goto LAB_0030ba7a;
      (this->changedRowFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start[row] =
           (this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[row];
    }
  }
  RVar3 = kOk;
LAB_0030ba7a:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return RVar3;
}

Assistant:

HPresolve::Result HPresolve::presolveChangedRows(
    HighsPostsolveStack& postsolve_stack) {
  std::vector<HighsInt> changedRows;
  changedRows.reserve(model->num_row_ - numDeletedRows);
  changedRows.swap(changedRowIndices);
  for (HighsInt row : changedRows) {
    if (rowDeleted[row]) continue;
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
    changedRowFlag[row] = rowDeleted[row];
  }

  return Result::kOk;
}